

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

void __thiscall soul::FunctionBuilder::addReturn(FunctionBuilder *this,Expression *value)

{
  ReturnValue *t;
  pool_ptr<soul::heart::Block> local_10;
  
  t = Module::allocate<soul::heart::ReturnValue,soul::heart::Expression&>
                ((this->super_BlockBuilder).module,value);
  local_10.object = (Block *)0x0;
  addTerminatorStatement(this,&t->super_Terminator,&local_10);
  return;
}

Assistant:

void addReturn (heart::Expression& value)
    {
        addTerminatorStatement (module.allocate<heart::ReturnValue> (value), nullptr);
    }